

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O0

int ncnn::compute_coord(int sx,int w,int padding_mode,int align_corner)

{
  int in_ECX;
  int in_EDX;
  int in_EDI;
  float fVar1;
  undefined4 local_4;
  
  if (in_EDX == 2) {
    fVar1 = border_coord(2,in_ECX);
    local_4 = (int)fVar1;
  }
  else {
    local_4 = in_EDI;
    if (in_EDX == 3) {
      if (in_ECX == 0) {
        reflect_coord(4.2039e-45,0);
        fVar1 = border_coord(in_EDX,in_ECX);
      }
      else {
        fVar1 = reflect_coord(4.2039e-45,in_ECX);
      }
      local_4 = (int)fVar1;
    }
  }
  return local_4;
}

Assistant:

static int compute_coord(int sx, int w, int padding_mode, int align_corner)
{
    if (padding_mode == 2) // border
    {
        sx = border_coord(sx, w - 1);
    }
    else if (padding_mode == 3) // reflection
    {
        if (align_corner)
        {
            sx = reflect_coord(sx, w - 1);
        }
        else
        {
            sx = static_cast<int>(reflect_coord(sx + 0.5f, w) - 0.5f);
            sx = border_coord(sx, w - 1);
        }
    }

    return sx;
}